

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformlayout.cpp
# Opt level: O3

void __thiscall QFormLayoutPrivate::setupVerticalLayoutData(QFormLayoutPrivate *this,int width)

{
  QList<QLayoutStruct> *this_00;
  ItemMatrix *this_01;
  QLayout *layout;
  long lVar1;
  long lVar2;
  QFormLayoutItem *this_02;
  QFormLayoutItem *this_03;
  uint uVar3;
  bool bVar4;
  byte bVar5;
  RowWrapPolicy RVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  Alignment AVar11;
  pointer ppQVar12;
  QSize QVar13;
  pointer pQVar14;
  QWidget *pQVar15;
  pointer pQVar16;
  QSize QVar17;
  QFormLayoutItem *prevItem1;
  long lVar18;
  ulong uVar19;
  bool recalculate;
  Representation RVar20;
  int iVar21;
  ulong uVar22;
  Representation RVar23;
  byte local_c5;
  int local_b4;
  QStyle *local_a0;
  QFormLayoutItem *local_90;
  int local_70;
  int local_6c;
  uint local_68;
  int local_64;
  
  layout = *(QLayout **)&(this->super_QLayoutPrivate).field_0x8;
  if (((this->layoutWidth == width) ||
      (this->thresh_width <= this->layoutWidth && this->thresh_width <= width)) &&
     ((this->field_0xb2 & 0x3c) == 0)) {
    return;
  }
  this->layoutWidth = width;
  uVar22 = (this->m_matrix).m_storage.d.size;
  RVar6 = QFormLayout::rowWrapPolicy((QFormLayout *)layout);
  this_00 = &this->vLayouts;
  QList<QLayoutStruct>::clear(this_00);
  uVar3 = (uint)(uVar22 >> 1);
  QList<QLayoutStruct>::resize(this_00,(long)(int)(uVar3 * 2 + 2));
  local_b4 = *(int *)(*(long *)&layout->field_0x8 + 0x164);
  if (((local_b4 < 0) && (local_b4 = qSmartSpacing(layout,PM_LayoutVerticalSpacing), local_b4 < 0))
     && (pQVar15 = QLayout::parentWidget(layout), pQVar15 != (QWidget *)0x0)) {
    local_a0 = QWidget::style(pQVar15);
  }
  else {
    local_a0 = (QStyle *)0x0;
  }
  this_01 = &this->m_matrix;
  updateSizes(this);
  this->maxLabelWidth = 0;
  if (RVar6 == WrapAllRows) {
    this->maxLabelWidth = width;
LAB_00399f93:
    if ((int)uVar3 < 1) {
      uVar22 = 1;
    }
    else {
      local_c5 = 1;
      lVar18 = 0;
      uVar19 = 0;
      uVar22 = 1;
      recalculate = false;
      local_90 = (QFormLayoutItem *)0x0;
      prevItem1 = (QFormLayoutItem *)0x0;
      do {
        ppQVar12 = QList<QFormLayoutItem_*>::data(&this_01->m_storage);
        this_02 = *(QFormLayoutItem **)((long)ppQVar12 + lVar18);
        ppQVar12 = QList<QFormLayoutItem_*>::data(&this_01->m_storage);
        this_03 = *(QFormLayoutItem **)((long)ppQVar12 + lVar18 + 8);
        bVar4 = QFormLayout::isRowVisible((QFormLayout *)layout,(int)uVar19);
        if (bVar4) {
          iVar8 = -1;
          QVar13.wd.m_i = -1;
          QVar13.ht.m_i = 0;
          RVar20.m_i = -1;
          iVar10 = -1;
          if (this_02 != (QFormLayoutItem *)0x0) {
            iVar10 = (this_02->minSize).ht.m_i;
            QVar13 = this_02->sizeHint;
            RVar20 = QVar13.ht.m_i;
          }
          QVar17.wd.m_i = -1;
          QVar17.ht.m_i = 0;
          RVar23.m_i = -1;
          if (this_03 != (QFormLayoutItem *)0x0) {
            QVar17 = this_03->minSize;
            RVar23 = QVar17.ht.m_i;
            iVar8 = (this_03->sizeHint).ht.m_i;
          }
          iVar21 = (int)uVar22;
          if (RVar6 == WrapLongRows) {
            bVar4 = true;
            if (QVar13.wd.m_i.m_i <= this->maxLabelWidth) {
              bVar4 = width < this->maxLabelWidth + QVar17.wd.m_i.m_i;
              goto LAB_0039a0b9;
            }
          }
          else {
            bVar4 = false;
LAB_0039a0b9:
            if ((RVar6 != WrapAllRows) && (bVar4 == false)) {
              if (this_02 == (QFormLayoutItem *)0x0) {
                local_70 = 0;
                local_6c = 0xffffff;
                local_68 = 0;
              }
              else {
                local_6c = (this_02->maxSize).ht.m_i;
                uVar7 = (*this_02->item->_vptr_QLayoutItem[5])();
                local_68 = uVar7 >> 1 & 0x7f;
                this_02->sideBySide = this_03 != (QFormLayoutItem *)0x0;
                this_02->vLayoutIndex = iVar21;
                local_70 = QFormLayoutItem::vStretch(this_02);
              }
              if (this_03 == (QFormLayoutItem *)0x0) {
                local_64 = 0xffffff;
                iVar9 = 0;
              }
              else {
                local_64 = (this_03->maxSize).ht.m_i;
                uVar7 = (*this_03->item->_vptr_QLayoutItem[5])();
                if ((uVar7 & 2) != 0) {
                  local_68 = 1;
                }
                bVar5 = true;
                if (this_02 == (QFormLayoutItem *)0x0) {
                  bVar5 = this_03->fullRow ^ 1;
                }
                this_03->sideBySide = (bool)bVar5;
                this_03->vLayoutIndex = iVar21;
                iVar9 = QFormLayoutItem::vStretch(this_03);
              }
              pQVar14 = QList<QLayoutStruct>::data(this_00);
              if (iVar9 < local_70) {
                iVar9 = local_70;
              }
              if (RVar23.m_i < iVar10) {
                RVar23.m_i = iVar10;
              }
              pQVar14[iVar21].stretch = iVar9;
              pQVar14[iVar21].sizeHint = RVar23.m_i;
              pQVar14[iVar21].minimumSize = RVar23.m_i;
              pQVar14[iVar21].maximumSize = 0x7ffff;
              pQVar14[iVar21].expansive = false;
              pQVar14[iVar21].empty = true;
              pQVar14[iVar21].spacing = 0;
              if (iVar8 < RVar20.m_i) {
                iVar8 = RVar20.m_i;
              }
              pQVar14 = QList<QLayoutStruct>::data(this_00);
              pQVar14[iVar21].sizeHint = iVar8;
              if (local_6c < local_64) {
                local_64 = local_6c;
              }
              pQVar14 = QList<QLayoutStruct>::data(this_00);
              pQVar14[iVar21].maximumSize = local_64;
              bVar4 = true;
              if ((local_68 & 1) == 0) {
                pQVar14 = QList<QLayoutStruct>::data(this_00);
                bVar4 = 0 < pQVar14[iVar21].stretch;
              }
              pQVar14 = QList<QLayoutStruct>::data(this_00);
              pQVar14[iVar21].expansive = bVar4;
              pQVar14 = QList<QLayoutStruct>::data(this_00);
              pQVar14[iVar21].empty = false;
              pQVar14 = QList<QLayoutStruct>::data(this_00);
              bVar4 = pQVar14[iVar21].expansive;
              if (1 < iVar21) {
                pQVar15 = QLayout::parentWidget(layout);
                iVar10 = spacingHelper(pQVar15,local_a0,local_b4,recalculate,this_02,this_03,
                                       prevItem1,local_90);
                pQVar14 = QList<QLayoutStruct>::data(this_00);
                pQVar14[uVar22 - 1].spacing = iVar10;
              }
              local_c5 = local_c5 & (bVar4 ^ 1U);
              local_90 = this_03;
              prevItem1 = this_02;
              if (this_02 == (QFormLayoutItem *)0x0) {
                local_90 = (QFormLayoutItem *)0x0;
                prevItem1 = this_03;
              }
              uVar22 = (ulong)(iVar21 + 1);
              bVar4 = false;
              goto LAB_0039a520;
            }
          }
          if (this_02 != (QFormLayoutItem *)0x0) {
            pQVar14 = QList<QLayoutStruct>::data(this_00);
            iVar8 = QFormLayoutItem::vStretch(this_02);
            iVar10 = (this_02->minSize).ht.m_i;
            pQVar14[iVar21].stretch = iVar8;
            pQVar14[iVar21].minimumSize = iVar10;
            pQVar14[iVar21].expansive = false;
            pQVar14[iVar21].empty = true;
            pQVar14[iVar21].spacing = 0;
            pQVar14[iVar21].sizeHint = (this_02->sizeHint).ht.m_i;
            pQVar14[iVar21].maximumSize = (this_02->maxSize).ht.m_i;
            iVar10 = (*this_02->item->_vptr_QLayoutItem[5])();
            pQVar14[iVar21].expansive = (bool)((byte)iVar10 >> 1 & 1);
            pQVar14[iVar21].empty = false;
            if (1 < iVar21) {
              pQVar15 = QLayout::parentWidget(layout);
              iVar10 = spacingHelper(pQVar15,local_a0,local_b4,(bool)(bVar4 | recalculate),this_02,
                                     (QFormLayoutItem *)0x0,prevItem1,local_90);
              pQVar14 = QList<QLayoutStruct>::data(this_00);
              pQVar14[uVar22 - 1].spacing = iVar10;
            }
            this_02->vLayoutIndex = iVar21;
            this_02->sideBySide = false;
            pQVar14 = QList<QLayoutStruct>::data(this_00);
            local_c5 = local_c5 & pQVar14[iVar21].stretch < 1;
            uVar22 = (ulong)(iVar21 + 1);
            local_90 = (QFormLayoutItem *)0x0;
            prevItem1 = this_02;
          }
          if (this_03 != (QFormLayoutItem *)0x0) {
            iVar21 = (int)uVar22;
            pQVar14 = QList<QLayoutStruct>::data(this_00);
            iVar8 = QFormLayoutItem::vStretch(this_03);
            iVar10 = (this_03->minSize).ht.m_i;
            pQVar14[iVar21].stretch = iVar8;
            pQVar14[iVar21].minimumSize = iVar10;
            pQVar14[iVar21].expansive = false;
            pQVar14[iVar21].empty = true;
            pQVar14[iVar21].spacing = 0;
            pQVar14[iVar21].sizeHint = (this_03->sizeHint).ht.m_i;
            pQVar14[iVar21].maximumSize = (this_03->maxSize).ht.m_i;
            iVar10 = (*this_03->item->_vptr_QLayoutItem[5])();
            pQVar14[iVar21].expansive = (bool)((byte)iVar10 >> 1 & 1);
            pQVar14[iVar21].empty = false;
            if (1 < iVar21) {
              pQVar15 = QLayout::parentWidget(layout);
              iVar10 = spacingHelper(pQVar15,local_a0,local_b4,(bool)(bVar4 | recalculate),this_03,
                                     (QFormLayoutItem *)0x0,prevItem1,local_90);
              pQVar14 = QList<QLayoutStruct>::data(this_00);
              pQVar14[uVar22 - 1].spacing = iVar10;
            }
            this_03->vLayoutIndex = iVar21;
            this_03->sideBySide = false;
            pQVar14 = QList<QLayoutStruct>::data(this_00);
            local_c5 = local_c5 & pQVar14[iVar21].stretch < 1;
            uVar22 = (ulong)(iVar21 + 1);
            local_90 = (QFormLayoutItem *)0x0;
            prevItem1 = this_03;
          }
        }
        else {
          if (this_02 != (QFormLayoutItem *)0x0) {
            this_02->vLayoutIndex = -1;
          }
          bVar4 = recalculate;
          if (this_03 != (QFormLayoutItem *)0x0) {
            this_03->vLayoutIndex = -1;
          }
        }
LAB_0039a520:
        recalculate = bVar4;
        uVar19 = uVar19 + 1;
        lVar18 = lVar18 + 0x10;
      } while ((uVar3 & 0x7fffffff) != uVar19);
      if (local_c5 == 0) {
        pQVar14 = QList<QLayoutStruct>::data(this_00);
        pQVar14->stretch = 0;
        pQVar14->sizeHint = 0;
        pQVar14->maximumSize = 0x7ffff;
        pQVar14->minimumSize = 0;
        pQVar14->expansive = false;
        pQVar14->empty = true;
        pQVar14->spacing = 0;
        goto LAB_0039a636;
      }
    }
  }
  else {
    if (0 < (int)uVar3) {
      uVar22 = (ulong)(uVar3 & 0x7fffffff);
      lVar18 = 0;
      do {
        ppQVar12 = QList<QFormLayoutItem_*>::data(&this_01->m_storage);
        lVar1 = *(long *)((long)ppQVar12 + lVar18);
        ppQVar12 = QList<QFormLayoutItem_*>::data(&this_01->m_storage);
        if (lVar1 != 0) {
          lVar2 = *(long *)((long)ppQVar12 + lVar18 + 8);
          if (lVar2 == 0) {
            iVar10 = 0;
          }
          else {
            iVar10 = *(int *)(lVar2 + 0xc);
          }
          iVar8 = *(int *)(lVar1 + 0x14);
          if (iVar10 + iVar8 <= width) {
            if (iVar8 < this->maxLabelWidth) {
              iVar8 = this->maxLabelWidth;
            }
            this->maxLabelWidth = iVar8;
          }
        }
        lVar18 = lVar18 + 0x10;
        uVar22 = uVar22 - 1;
      } while (uVar22 != 0);
      goto LAB_00399f93;
    }
    uVar22 = 1;
  }
  AVar11 = QFormLayout::formAlignment((QFormLayout *)layout);
  if (((uint)AVar11.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
             super_QFlagsStorage<Qt::AlignmentFlag>.i & 0x40) == 0) {
    iVar10 = (int)uVar22;
    pQVar16 = QList<QLayoutStruct>::data(this_00);
    pQVar14 = pQVar16 + iVar10;
    pQVar14->stretch = 1;
    pQVar14->sizeHint = 0;
    pQVar14->maximumSize = 0x7ffff;
    pQVar14->minimumSize = 0;
    pQVar16[iVar10].expansive = false;
    pQVar16[iVar10].empty = true;
    pQVar16[iVar10].spacing = 0;
    pQVar14 = QList<QLayoutStruct>::data(this_00);
    pQVar14[iVar10].expansive = true;
    uVar22 = (ulong)(iVar10 + 1);
  }
  pQVar14 = QList<QLayoutStruct>::data(this_00);
  if (((uint)AVar11.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
             super_QFlagsStorage<Qt::AlignmentFlag>.i & 0xc0) == 0) {
    pQVar14->stretch = 0;
    pQVar14->sizeHint = 0;
    pQVar14->maximumSize = 0x7ffff;
    pQVar14->minimumSize = 0;
    pQVar14->expansive = false;
    pQVar14->empty = true;
    pQVar14->spacing = 0;
  }
  else {
    pQVar14->stretch = 1;
    pQVar14->sizeHint = 0;
    pQVar14->maximumSize = 0x7ffff;
    pQVar14->minimumSize = 0;
    pQVar14->expansive = false;
    pQVar14->empty = true;
    pQVar14->spacing = 0;
    pQVar14 = QList<QLayoutStruct>::data(this_00);
    pQVar14->expansive = true;
  }
LAB_0039a636:
  this->vLayoutCount = (int)uVar22;
  this->field_0xb2 = this->field_0xb2 & 0xf3;
  return;
}

Assistant:

void QFormLayoutPrivate::setupVerticalLayoutData(int width)
{
    Q_Q(QFormLayout);

    // Early out if we have no changes that would cause a change in vertical layout
    if ((width == layoutWidth || (width >= thresh_width && layoutWidth >= thresh_width)) && !dirty && !sizesDirty)
        return;

    layoutWidth = width;

    int rr = m_matrix.rowCount();
    int vidx = 1;
    QFormLayout::RowWrapPolicy rowWrapPolicy = q->rowWrapPolicy();
    bool wrapAllRows = (rowWrapPolicy == QFormLayout::WrapAllRows);
    bool addTopBottomStretch = true;

    vLayouts.clear();
    vLayouts.resize((2 * rr) + 2); // a max, some may be unused

    QStyle *style = nullptr;

    int userVSpacing = q->verticalSpacing();

    if (userVSpacing < 0) {
        if (QWidget *widget = q->parentWidget())
            style = widget->style();
    }

    // make sure our sizes are up to date
    updateSizes();

    // Grab the widest label width here
    // This might be different from the value computed during
    // sizeHint/minSize, since we don't count label/field pairs that
    // are split.
    maxLabelWidth = 0;
    if (!wrapAllRows) {
        for (int i = 0; i < rr; ++i) {
            const QFormLayoutItem *label = m_matrix(i, 0);
            const QFormLayoutItem *field = m_matrix(i, 1);
            if (label && (label->sizeHint.width() + (field ? field->minSize.width() : 0) <= width))
                maxLabelWidth = qMax(maxLabelWidth, label->sizeHint.width());
        }
    } else {
        maxLabelWidth = width;
    }

    QFormLayoutItem *prevItem1 = nullptr;
    QFormLayoutItem *prevItem2 = nullptr;
    bool prevRowSplit = false;

    for (int i = 0; i < rr; ++i) {
        QFormLayoutItem *label = m_matrix(i, 0);
        QFormLayoutItem *field = m_matrix(i, 1);

        // Ignore empty rows or rows with only hidden items,
        // and invalidate their position in the layout.
        if (!q->isRowVisible(i)) {
            if (label)
                label->vLayoutIndex = -1;
            if (field)
                field->vLayoutIndex = -1;
            continue;
        }

        QSize min1;
        QSize min2;
        QSize sh1;
        QSize sh2;
        if (label) {
            min1 = label->minSize;
            sh1 = label->sizeHint;
        }
        if (field) {
            min2 = field->minSize;
            sh2 = field->sizeHint;
        }

        // In separate lines, we make a vLayout for everything that isn't null
        // in side by side, we only separate label/field if we're going to wrap it
        bool splitSideBySide = (rowWrapPolicy == QFormLayout::WrapLongRows)
                                && ((maxLabelWidth < sh1.width()) || (width < (maxLabelWidth + min2.width())));

        if (wrapAllRows || splitSideBySide) {
            if (label) {
                initLayoutStruct(vLayouts[vidx], label);

                if (vidx > 1)
                    vLayouts[vidx - 1].spacing = spacingHelper(q->parentWidget(), style, userVSpacing, splitSideBySide || prevRowSplit, label, nullptr, prevItem1, prevItem2);

                label->vLayoutIndex = vidx;
                label->sideBySide = false;

                prevItem1 = label;
                prevItem2 = nullptr;

                if (vLayouts[vidx].stretch > 0)
                    addTopBottomStretch = false;

                ++vidx;
            }

            if (field) {
                initLayoutStruct(vLayouts[vidx], field);

                if (vidx > 1)
                    vLayouts[vidx - 1].spacing = spacingHelper(q->parentWidget(), style, userVSpacing, splitSideBySide || prevRowSplit, field, nullptr, prevItem1, prevItem2);

                field->vLayoutIndex = vidx;
                field->sideBySide = false;

                prevItem1 = field;
                prevItem2 = nullptr;

                if (vLayouts[vidx].stretch > 0)
                    addTopBottomStretch = false;

                ++vidx;
            }

            prevRowSplit = splitSideBySide;
        } else {
            // we're in side by side mode, and we have enough space to do that
            QSize max1(QWIDGETSIZE_MAX, QWIDGETSIZE_MAX);
            QSize max2(QWIDGETSIZE_MAX, QWIDGETSIZE_MAX);

            int stretch1 = 0;
            int stretch2 = 0;
            bool expanding = false;

            if (label) {
                max1 = label->maxSize;
                if (label->expandingDirections() & Qt::Vertical)
                    expanding = true;

                label->sideBySide = (field != nullptr);
                label->vLayoutIndex = vidx;
                stretch1 = label->vStretch();
            }

            if (field) {
                max2 = field->maxSize;
                if (field->expandingDirections() & Qt::Vertical)
                    expanding = true;

                field->sideBySide = (label || !field->fullRow);
                field->vLayoutIndex = vidx;
                stretch2 = field->vStretch();
            }

            vLayouts[vidx].init(qMax(stretch1, stretch2), qMax(min1.height(), min2.height()));
            vLayouts[vidx].sizeHint = qMax(sh1.height(), sh2.height());
            vLayouts[vidx].maximumSize = qMin(max1.height(), max2.height());
            vLayouts[vidx].expansive = expanding || (vLayouts[vidx].stretch > 0);
            vLayouts[vidx].empty = false;

            if (vLayouts[vidx].expansive)
                addTopBottomStretch = false;

            if (vidx > 1)
                vLayouts[vidx - 1].spacing = spacingHelper(q->parentWidget(), style, userVSpacing, prevRowSplit, label, field, prevItem1, prevItem2);

            if (label) {
                prevItem1 = label;
                prevItem2 = field;
            } else {
                prevItem1 = field;
                prevItem2 = nullptr;
            }

            prevRowSplit = false;
            ++vidx;
        }
    }

    if (addTopBottomStretch) {
        Qt::Alignment formAlignment = q->formAlignment();

        if (!(formAlignment & Qt::AlignBottom)) {
            // AlignTop (default if unspecified) or AlignVCenter: We add a stretch at the bottom
            vLayouts[vidx].init(1, 0);
            vLayouts[vidx].expansive = true;
            ++vidx;
        }

        if (formAlignment & (Qt::AlignVCenter | Qt::AlignBottom)) {
            // AlignVCenter or AlignBottom: We add a stretch at the top
            vLayouts[0].init(1, 0);
            vLayouts[0].expansive = true;
        } else {
            vLayouts[0].init(0, 0);
        }
    } else {
        vLayouts[0].init(0, 0);
    }

    vLayoutCount = vidx;
    dirty = false;
}